

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O3

void llvm::llvm_unreachable_internal(char *msg,char *file,uint line)

{
  size_t sVar1;
  
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,msg,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"UNREACHABLE executed",0x14);
  if (file != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at ",4);
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,file,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"!\n");
  abort();
}

Assistant:

void llvm::llvm_unreachable_internal(const char *msg, const char *file,
                                     unsigned line) {
  // This code intentionally doesn't call the ErrorHandler callback, because
  // llvm_unreachable is intended to be used to indicate "impossible"
  // situations, and not legitimate runtime errors.
  // XXX BINARYEN: use cout
  if (msg)
    std::cout << msg << "\n";
  std::cout << "UNREACHABLE executed";
  if (file)
    std::cout << " at " << file << ":" << line;
  std::cout << "!\n";
  abort();
#ifdef LLVM_BUILTIN_UNREACHABLE
  // Windows systems and possibly others don't declare abort() to be noreturn,
  // so use the unreachable builtin to avoid a Clang self-host warning.
  LLVM_BUILTIN_UNREACHABLE;
#endif
}